

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPath.c
# Opt level: O1

double Abc_GraphCountPaths_rec
                 (int Lev,int Node,Vec_Wec_t *vNodes,double **pCache,int *pBuffer,Vec_Int_t *vEdges)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  
  if (Node == -2) {
    dVar2 = 1.0;
  }
  else if (Node == -1) {
    dVar2 = 0.0;
  }
  else {
    dVar2 = pCache[Lev][Node];
    if ((dVar2 == -1.0) && (!NAN(dVar2))) {
      pBuffer[Lev] = 0;
      if ((-1 < Lev) && (Lev < vNodes->nSize)) {
        if (-1 < Node) {
          uVar1 = Node * 2;
          if ((int)uVar1 < vNodes->pArray[(uint)Lev].nSize) {
            dVar2 = Abc_GraphCountPaths_rec
                              (Lev + 1,vNodes->pArray[(uint)Lev].pArray[uVar1],vNodes,pCache,pBuffer
                               ,vEdges);
            pBuffer[Lev] = 1;
            if (vNodes->nSize <= Lev) goto LAB_0049278b;
            if ((int)(uVar1 | 1) < vNodes->pArray[(uint)Lev].nSize) {
              dVar3 = Abc_GraphCountPaths_rec
                                (Lev + 1,vNodes->pArray[(uint)Lev].pArray[uVar1 | 1],vNodes,pCache,
                                 pBuffer,vEdges);
              pCache[Lev][Node] = dVar2 + dVar3;
              return dVar2 + dVar3;
            }
          }
        }
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
LAB_0049278b:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                    ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
    }
  }
  return dVar2;
}

Assistant:

double Abc_GraphCountPaths_rec( int Lev, int Node, Vec_Wec_t * vNodes, double ** pCache, int * pBuffer, Vec_Int_t * vEdges )
{
    double Res0, Res1;
//    if ( Node == -2 ) Abc_GraphPathPrint4( pBuffer, vEdges );
    if ( Node == -2 )
        return 1;
    if ( Node == -1 )
        return 0;
    if ( pCache[Lev][Node] != -1.0 )
        return pCache[Lev][Node];
    pBuffer[Lev] = 0;
    Res0 = Abc_GraphCountPaths_rec( Lev+1, Vec_IntEntry( Vec_WecEntry(vNodes, Lev), 2*Node   ), vNodes, pCache, pBuffer, vEdges );
    pBuffer[Lev] = 1;
    Res1 = Abc_GraphCountPaths_rec( Lev+1, Vec_IntEntry( Vec_WecEntry(vNodes, Lev), 2*Node+1 ), vNodes, pCache, pBuffer, vEdges );
    return (pCache[Lev][Node] = Res0 + Res1);
}